

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.hpp
# Opt level: O3

void __thiscall
vk::BinaryRegistryDetail::ProgramIdentifierIndex::ProgramIdentifierIndex
          (ProgramIdentifierIndex *this,ProgramIdentifier *id_,deUint32 index_)

{
  pointer pcVar1;
  
  (this->id).testCasePath._M_dataplus._M_p = (pointer)&(this->id).testCasePath.field_2;
  pcVar1 = (id_->testCasePath)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (id_->testCasePath)._M_string_length);
  (this->id).programName._M_dataplus._M_p = (pointer)&(this->id).programName.field_2;
  pcVar1 = (id_->programName)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->id).programName,pcVar1,pcVar1 + (id_->programName)._M_string_length);
  this->index = index_;
  return;
}

Assistant:

ProgramIdentifierIndex (const ProgramIdentifier&	id_,
							deUint32					index_)
		: id	(id_)
		, index	(index_)
	{}